

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

Log * __thiscall Log::GetSystemTime_abi_cxx11_(Log *this)

{
  allocator local_229;
  char local_228 [8];
  char content [512];
  tm *tmstr;
  time_t now;
  Log *this_local;
  
  this_local = this;
  tmstr = (tm *)time((time_t *)0x0);
  content._504_8_ = localtime((time_t *)&tmstr);
  memset(local_228,0,0x200);
  sprintf(local_228,"[%04d-%02d-%02d %02d:%02d:%02d]",
          (ulong)(*(int *)(content._504_8_ + 0x14) + 0x76c),
          (ulong)(*(int *)(content._504_8_ + 0x10) + 1),(ulong)*(uint *)(content._504_8_ + 0xc),
          (ulong)*(uint *)(content._504_8_ + 8),*(undefined4 *)(content._504_8_ + 4),
          *(undefined4 *)content._504_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,local_228,&local_229);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  return this;
}

Assistant:

string Log::GetSystemTime()
{
    time_t now = time(NULL);
    struct tm* tmstr = localtime(&now);
    char content[512] = { 0 };
    sprintf(content, "[%04d-%02d-%02d %02d:%02d:%02d]",
    tmstr->tm_year + 1900,
    tmstr->tm_mon + 1,
    tmstr->tm_mday,
    tmstr->tm_hour,
    tmstr->tm_min,
    tmstr->tm_sec);
    return string(content);
}